

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_bbdpre.c
# Opt level: O2

int CVBBDPrecSetup(sunrealtype t,N_Vector y,N_Vector fy,int jok,int *jcurPtr,sunrealtype gamma,
                  void *bbd_data)

{
  CVodeMem cv_mem;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  sunrealtype *psVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  char *msgfmt;
  long j;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double local_b8;
  long local_a8;
  long local_98;
  
  cv_mem = *(CVodeMem *)((long)bbd_data + 0x98);
  if (jok == 0) {
    *jcurPtr = 1;
    iVar7 = SUNMatZero(*(undefined8 *)((long)bbd_data + 0x38));
    if (iVar7 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar7 = 0x1f7;
      goto LAB_00110f66;
    }
    if (iVar7 != 0) {
      return 1;
    }
    uVar1 = *(undefined8 *)((long)bbd_data + 0x50);
    uVar2 = *(undefined8 *)((long)bbd_data + 0x58);
    uVar3 = *(undefined8 *)((long)bbd_data + 0x60);
    lVar4 = *(long *)((long)bbd_data + 0x98);
    N_VScale(0x3ff0000000000000,y,uVar2);
    if ((*(code **)((long)bbd_data + 0x30) == (code *)0x0) ||
       (iVar7 = (**(code **)((long)bbd_data + 0x30))
                          (t,*(undefined8 *)((long)bbd_data + 0x78),y,*(undefined8 *)(lVar4 + 0x18))
       , iVar7 == 0)) {
      iVar7 = (**(code **)((long)bbd_data + 0x28))
                        (t,*(undefined8 *)((long)bbd_data + 0x78),uVar2,uVar1,
                         *(undefined8 *)(lVar4 + 0x18));
      *(long *)((long)bbd_data + 0x90) = *(long *)((long)bbd_data + 0x90) + 1;
      if (iVar7 == 0) {
        lVar8 = N_VGetArrayPointer(y);
        lVar9 = N_VGetArrayPointer(uVar1);
        lVar10 = N_VGetArrayPointer(*(undefined8 *)(lVar4 + 200));
        lVar11 = N_VGetArrayPointer(uVar2);
        lVar12 = N_VGetArrayPointer(uVar3);
        if (*(int *)(lVar4 + 0x58) == 0) {
          local_a8 = 0;
        }
        else {
          local_a8 = N_VGetArrayPointer(*(undefined8 *)(lVar4 + 0x108));
        }
        dVar21 = (double)N_VWrmsNorm(uVar1);
        lVar20 = *(long *)((long)bbd_data + 0x78);
        local_b8 = 1.0;
        if ((dVar21 != 0.0) || (NAN(dVar21))) {
          local_b8 = dVar21 * (double)lVar20 *
                              ABS(*(double *)(lVar4 + 0x140)) * 1000.0 * *(double *)(lVar4 + 8);
        }
        lVar5 = *bbd_data;
        lVar6 = *(long *)((long)bbd_data + 8);
        lVar19 = lVar6 + lVar5 + 1;
        lVar17 = lVar20;
        if (lVar19 < lVar20) {
          lVar17 = lVar19;
        }
        if (lVar17 < 1) {
          lVar17 = 0;
        }
        local_98 = 0;
        for (lVar15 = 1; lVar15 != lVar17 + 1; lVar15 = lVar15 + 1) {
          j = lVar15 + -1;
          for (lVar13 = j; lVar13 < lVar20; lVar13 = lVar13 + lVar19) {
            dVar21 = *(double *)(lVar8 + lVar13 * 8);
            dVar24 = ABS(dVar21) * *(double *)((long)bbd_data + 0x20);
            dVar22 = local_b8 / *(double *)(lVar10 + lVar13 * 8);
            if (dVar24 <= dVar22) {
              dVar24 = dVar22;
            }
            if (*(int *)(lVar4 + 0x58) != 0) {
              dVar22 = *(double *)(local_a8 + lVar13 * 8);
              dVar23 = ABS(dVar22);
              dVar21 = dVar21 + dVar24;
              if ((dVar23 != 1.0) || (NAN(dVar23))) {
                if ((dVar23 == 2.0) && ((!NAN(dVar23) && (dVar21 * dVar22 <= 0.0))))
                goto LAB_00111100;
              }
              else if (dVar21 * dVar22 < 0.0) {
LAB_00111100:
                dVar24 = -dVar24;
              }
            }
            *(double *)(lVar11 + lVar13 * 8) = dVar24 + *(double *)(lVar11 + lVar13 * 8);
          }
          iVar7 = (**(code **)((long)bbd_data + 0x28))
                            (lVar20,uVar2,uVar3,*(undefined8 *)(lVar4 + 0x18));
          *(long *)((long)bbd_data + 0x90) = *(long *)((long)bbd_data + 0x90) + 1;
          if (iVar7 != 0) goto LAB_001112f8;
          lVar20 = *(long *)((long)bbd_data + 0x78);
          lVar13 = local_98;
          for (; j < lVar20; j = j + lVar19) {
            dVar21 = *(double *)(lVar8 + j * 8);
            *(double *)(lVar11 + j * 8) = dVar21;
            psVar14 = SUNBandMatrix_Column(*(SUNMatrix *)((long)bbd_data + 0x38),j);
            dVar24 = ABS(*(double *)(lVar8 + j * 8)) * *(double *)((long)bbd_data + 0x20);
            dVar22 = local_b8 / *(double *)(lVar10 + j * 8);
            if (dVar24 <= dVar22) {
              dVar24 = dVar22;
            }
            if (*(int *)(lVar4 + 0x58) != 0) {
              dVar22 = *(double *)(local_a8 + j * 8);
              dVar23 = ABS(dVar22);
              dVar21 = dVar21 + dVar24;
              if ((dVar23 != 1.0) || (NAN(dVar23))) {
                if ((dVar23 == 2.0) && ((!NAN(dVar23) && (dVar21 * dVar22 <= 0.0))))
                goto LAB_0011124c;
              }
              else if (dVar21 * dVar22 < 0.0) {
LAB_0011124c:
                dVar24 = -dVar24;
              }
            }
            lVar16 = j - *(long *)((long)bbd_data + 0x10);
            if (lVar16 < 1) {
              lVar16 = 0;
            }
            lVar18 = *(long *)((long)bbd_data + 0x18) + j;
            lVar20 = *(long *)((long)bbd_data + 0x78);
            if (lVar20 + -1 <= lVar18) {
              lVar18 = lVar20 + -1;
            }
            for (; lVar16 <= lVar18; lVar16 = lVar16 + 1) {
              *(double *)((long)psVar14 + lVar16 * 8 + lVar13) =
                   (*(double *)(lVar12 + lVar16 * 8) - *(double *)(lVar9 + lVar16 * 8)) *
                   (1.0 / dVar24);
            }
            lVar13 = lVar13 + ~(lVar6 + lVar5) * 8;
          }
          local_98 = local_98 + -8;
        }
        iVar7 = SUNMatCopy(t,*(undefined8 *)((long)bbd_data + 0x38),
                           *(undefined8 *)((long)bbd_data + 0x40));
        if (iVar7 < 0) {
          msgfmt = "An error arose from a SUNBandMatrix routine.";
          iVar7 = 0x209;
          goto LAB_00110f66;
        }
        goto joined_r0x001112e5;
      }
    }
LAB_001112f8:
    if (-1 < iVar7) {
      return 1;
    }
    msgfmt = "The gloc or cfn routine failed in an unrecoverable manner.";
    iVar7 = 0x200;
  }
  else {
    *jcurPtr = 0;
    iVar7 = SUNMatCopy(*(undefined8 *)((long)bbd_data + 0x38),*(undefined8 *)((long)bbd_data + 0x40)
                      );
    if (iVar7 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar7 = 0x1e9;
      goto LAB_00110f66;
    }
joined_r0x001112e5:
    if (iVar7 != 0) {
      return 1;
    }
    iVar7 = SUNMatScaleAddI(-gamma,*(undefined8 *)((long)bbd_data + 0x40));
    if (iVar7 == 0) {
      iVar7 = SUNLinSolSetup_Band(*(SUNLinearSolver *)((long)bbd_data + 0x48),
                                  *(SUNMatrix *)((long)bbd_data + 0x40));
      return iVar7;
    }
    msgfmt = "An error arose from a SUNBandMatrix routine.";
    iVar7 = 0x214;
  }
LAB_00110f66:
  cvProcessError(cv_mem,-1,iVar7,"CVBBDPrecSetup",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bbdpre.c"
                 ,msgfmt);
  return -1;
}

Assistant:

static int CVBBDPrecSetup(sunrealtype t, N_Vector y,
                          SUNDIALS_MAYBE_UNUSED N_Vector fy, sunbooleantype jok,
                          sunbooleantype* jcurPtr, sunrealtype gamma,
                          void* bbd_data)
{
  CVBBDPrecData pdata;
  CVodeMem cv_mem;
  int retval;

  pdata  = (CVBBDPrecData)bbd_data;
  cv_mem = (CVodeMem)pdata->cvode_mem;

  /* If jok = SUNTRUE, use saved copy of J */
  if (jok)
  {
    *jcurPtr = SUNFALSE;
    retval   = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBBD_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }

    /* Otherwise call CVBBDDQJac for new J value */
  }
  else
  {
    *jcurPtr = SUNTRUE;
    retval   = SUNMatZero(pdata->savedJ);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBBD_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = CVBBDDQJac(pdata, t, y, pdata->tmp1, pdata->tmp2, pdata->tmp3);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBBD_FUNC_FAILED);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBBD_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }

  /* Scale and add I to get P = I - gamma*J */
  retval = SUNMatScaleAddI(-gamma, pdata->savedP);
  if (retval)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBBD_SUNMAT_FAIL);
    return (-1);
  }

  /* Do LU factorization of matrix and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->savedP);
  return (retval);
}